

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O2

bool __thiscall cert::World::intersects(World *this,Ray *r,float t_min,float t_max)

{
  ulong uVar1;
  Shape *pSVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    uVar1 = (this->shapes).m_size;
    if (uVar1 <= uVar5) break;
    pSVar2 = (this->shapes).m_data[uVar5];
    iVar4 = (*pSVar2->_vptr_Shape[2])(t_min,t_max,pSVar2,r);
    uVar3 = uVar5 + 1;
  } while ((char)iVar4 == '\0');
  return uVar5 < uVar1;
}

Assistant:

constexpr bool intersects (const Ray& r, float t_min, float t_max) const
	{
		for (int i = 0; i < shapes.size (); i++)
		{
			bool hit = shapes.at (i)->intersects (r, t_min, t_max);
			if (hit) return true;
		}
		return false;
	}